

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

int __thiscall QStackedLayout::heightForWidth(QStackedLayout *this,int width)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  undefined4 in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QLayoutItem *item;
  int i;
  int n;
  int hfw;
  int local_34;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(*in_RDI + 200))();
  local_c = 0;
  for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_34);
    if ((plVar2 != (long *)0x0) &&
       (plVar2 = (long *)(**(code **)(*plVar2 + 0x68))(), plVar2 != (long *)0x0)) {
      local_10 = (**(code **)(*plVar2 + 0x80))(plVar2,in_ESI);
      piVar3 = qMax<int>(&local_c,&local_10);
      local_c = *piVar3;
    }
  }
  (**(code **)(*in_RDI + 0x90))();
  local_14 = QSize::height((QSize *)0x3508f3);
  piVar3 = qMax<int>(&local_c,&local_14);
  local_c = *piVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

int QStackedLayout::heightForWidth(int width) const
{
    const int n = count();

    int hfw = 0;
    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (QWidget *w = item->widget())
                /*
                Note: Does not query the layout item, but bypasses it and asks the widget
                directly. This is consistent with how QStackedLayout::sizeHint() is
                implemented. This also avoids an issue where QWidgetItem::heightForWidth()
                returns -1 if the widget is hidden.
                */
                hfw = qMax(hfw, w->heightForWidth(width));
        }
    }
    hfw = qMax(hfw, minimumSize().height());
    return hfw;
}